

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O2

basic_string_view<char,_std::char_traits<char>_> __thiscall
jsoncons::basic_staj_event<char>::get<std::basic_string_view<char,std::char_traits<char>>>
          (basic_staj_event<char> *this)

{
  ser_error *this_00;
  error_code ec_00;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  bVar1 = get<std::basic_string_view<char,std::char_traits<char>>>(this,&ec);
  if (ec._M_value == 0) {
    return bVar1;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this_00,ec_00);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }